

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

exr_result_t exr_write_header(exr_context_t ctxt)

{
  _internal_exr_part *curpart;
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int32_t val;
  exr_result_t eVar6;
  long lVar7;
  int unaff_EBP;
  long lVar8;
  ulong uVar9;
  
  if (ctxt == (exr_context_t)0x0) {
    unaff_EBP = 2;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x1) {
      eVar6 = (**(code **)(ctxt + 0x38))(ctxt,8);
      return eVar6;
    }
    if (*(int *)(ctxt + 0xc4) == 0) {
      eVar6 = (**(code **)(ctxt + 0x40))(ctxt,6,"No parts defined in file prior to writing data");
      return eVar6;
    }
    bVar4 = true;
    if (*(int *)(ctxt + 0xc4) < 1) {
      iVar5 = 0;
    }
    else {
      uVar9 = 0;
      do {
        curpart = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + uVar9 * 8);
        if (curpart->channels == (exr_attribute_t *)0x0) {
          bVar3 = false;
          unaff_EBP = (**(code **)(ctxt + 0x48))
                                (ctxt,0xd,"Part %d is missing channel list",uVar9 & 0xffffffff);
          bVar4 = false;
          iVar5 = 0;
        }
        else {
          bVar3 = false;
          iVar5 = internal_exr_compute_tile_information((_internal_exr_context *)ctxt,curpart,0);
          bVar4 = true;
          if (iVar5 == 0) {
            val = internal_exr_compute_chunk_offset_size(curpart);
            curpart->chunk_count = val;
            if (((ctxt[4] == (_priv_exr_context_t)0x0) && (ctxt[5] == (_priv_exr_context_t)0x0)) ||
               (iVar5 = exr_attr_set_int(ctxt,(int)uVar9,"chunkCount",val), iVar5 == 0)) {
              iVar5 = internal_exr_validate_write_part((_internal_exr_context *)ctxt,curpart);
              bVar3 = true;
              bVar4 = false;
            }
            else {
              bVar3 = false;
            }
          }
        }
        if (!bVar3) goto LAB_00114f1e;
      } while ((iVar5 == 0) && (uVar9 = uVar9 + 1, (long)uVar9 < (long)*(int *)(ctxt + 0xc4)));
      bVar4 = true;
    }
LAB_00114f1e:
    if (bVar4) {
      *(undefined8 *)(ctxt + 0xb0) = 0;
      if (iVar5 == 0) {
        iVar5 = internal_exr_write_header((_internal_exr_context *)ctxt);
      }
      unaff_EBP = iVar5;
      if (iVar5 == 0) {
        *ctxt = (_priv_exr_context_t)0x3;
        *(undefined8 *)(ctxt + 0xb8) = 0xffffffff00000000;
        *(undefined4 *)(ctxt + 0xc0) = 0;
        iVar5 = *(int *)(ctxt + 0xc4);
        if (0 < (long)iVar5) {
          lVar7 = *(long *)(ctxt + 0xb0);
          lVar1 = *(long *)(ctxt + 0x1d8);
          lVar8 = 0;
          do {
            lVar2 = *(long *)(lVar1 + lVar8 * 8);
            *(long *)(lVar2 + 0xf8) = lVar7;
            lVar7 = lVar7 + (long)*(int *)(lVar2 + 0xf4) * 8;
            lVar8 = lVar8 + 1;
          } while (iVar5 != lVar8);
          *(long *)(ctxt + 0xb0) = lVar7;
        }
      }
    }
  }
  return unaff_EBP;
}

Assistant:

exr_result_t
exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    EXR_PROMOTE_LOCKED_CONTEXT_OR_ERROR (ctxt);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (pctxt->num_parts == 0)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "No parts defined in file prior to writing data"));

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < pctxt->num_parts; ++p)
    {
        struct _internal_exr_part* curp = pctxt->parts[p];

        int32_t ccount = 0;

        if (!curp->channels)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Part %d is missing channel list",
                p));

        rv = internal_exr_compute_tile_information (pctxt, curp, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curp);

        curp->chunk_count = ccount;

        if (pctxt->has_nonimage_data || pctxt->is_multipart)
        {
            EXR_UNLOCK (pctxt);
            rv = exr_attr_set_int (ctxt, p, EXR_REQ_CHUNK_COUNT_STR, ccount);
            EXR_LOCK (pctxt);
            if (rv != EXR_ERR_SUCCESS) break;
        }

        rv = internal_exr_validate_write_part (pctxt, curp);
    }

    pctxt->output_file_offset = 0;

    if (rv == EXR_ERR_SUCCESS) rv = internal_exr_write_header (pctxt);

    if (rv == EXR_ERR_SUCCESS)
    {
        pctxt->mode               = EXR_CONTEXT_WRITING_DATA;
        pctxt->cur_output_part    = 0;
        pctxt->last_output_chunk  = -1;
        pctxt->output_chunk_count = 0;
        for (int p = 0; rv == EXR_ERR_SUCCESS && p < pctxt->num_parts; ++p)
        {
            struct _internal_exr_part* curp = pctxt->parts[p];
            curp->chunk_table_offset        = pctxt->output_file_offset;
            pctxt->output_file_offset +=
                (uint64_t) (curp->chunk_count) * sizeof (uint64_t);
        }
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}